

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommunicationsChannelType.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::CommunicationsChannelType::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,CommunicationsChannelType *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"Communications Channel Type:");
  poVar1 = std::operator<<(poVar1,"\n\tType  : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->field_0).m_ui8CommChannelType & 0x7f);
  poVar1 = std::operator<<(poVar1,"\n\tClass : ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(ushort)((this->field_0).m_ui8CommChannelType >> 7));
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString CommunicationsChannelType::GetAsString() const
{
    KStringStream ss;

    ss << "Communications Channel Type:"
       << "\n\tType  : " << ( KUINT16 )m_ui8Type
       << "\n\tClass : " << ( KUINT16 )m_ui8Class
       << "\n";

    return ss.str();
}